

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_strncpy(char *dst,int dst_sz,char *src,int _num)

{
  long lVar1;
  ulong uVar2;
  code *pcVar3;
  uint uVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  int var__a;
  
  if (dst == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0xd9,"dst");
    pcVar3 = (code *)swi(3);
    pcVar5 = (char *)(*pcVar3)();
    return pcVar5;
  }
  if (src == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0xda,"src");
    pcVar3 = (code *)swi(3);
    pcVar5 = (char *)(*pcVar3)();
    return pcVar5;
  }
  uVar4 = -(int)src & 7;
  lVar7 = 0;
  do {
    uVar8 = _num;
    if (((int)src + (int)lVar7 & 7U) == 0) {
      iVar6 = 0;
      pcVar5 = src;
      goto LAB_00105c50;
    }
    lVar1 = lVar7 + 1;
    pcVar5 = src + lVar7;
    lVar7 = lVar1;
  } while (*pcVar5 != '\0');
  uVar8 = (int)lVar1 - 1;
  if (_num <= (int)uVar8) {
    uVar8 = _num;
  }
  goto LAB_00105d04;
LAB_00105c50:
  uVar2 = *(ulong *)(pcVar5 + uVar4);
  if ((~(0x101010101010100 - uVar2 | uVar2) & 0x8080808080808080) != 0) {
    if (_num < (int)(uVar4 + iVar6)) goto LAB_00105d04;
    if ((char)uVar2 == '\0') {
      uVar8 = uVar4 + iVar6;
      goto LAB_00105d04;
    }
    if ((uVar2 & 0xff00) == 0) {
      uVar4 = uVar4 + iVar6 + 1;
      goto LAB_00105cfd;
    }
    if ((uVar2 & 0xff0000) == 0) {
      uVar4 = uVar4 + iVar6 + 2;
      goto LAB_00105cfd;
    }
    if ((char)(uVar2 >> 0x18) == '\0') {
      uVar4 = uVar4 + iVar6 + 3;
      goto LAB_00105cfd;
    }
    if ((char)(uVar2 >> 0x20) == '\0') {
      uVar4 = uVar4 + iVar6 + 4;
      goto LAB_00105cfd;
    }
    if ((char)(uVar2 >> 0x28) == '\0') {
      uVar4 = uVar4 + iVar6 + 5;
      goto LAB_00105cfd;
    }
    if ((char)(uVar2 >> 0x30) == '\0') {
      uVar4 = uVar4 + iVar6 + 6;
      goto LAB_00105cfd;
    }
    if (uVar2 >> 0x38 == 0) goto LAB_00105cf8;
  }
  iVar6 = iVar6 + 8;
  pcVar5 = pcVar5 + 8;
  goto LAB_00105c50;
LAB_00105cf8:
  uVar4 = uVar4 + iVar6 + 7;
LAB_00105cfd:
  if ((int)uVar4 < _num) {
    uVar8 = uVar4;
  }
LAB_00105d04:
  uVar4 = dst_sz - 1U;
  if ((int)uVar8 < (int)(dst_sz - 1U)) {
    uVar4 = uVar8;
  }
  if (0 < (int)uVar4) {
    memcpy(dst,src,(ulong)uVar4);
  }
  dst[(int)uVar4] = '\0';
  return dst + (int)uVar4;
}

Assistant:

char* sx_strncpy(char* SX_RESTRICT dst, int dst_sz, const char* SX_RESTRICT src, int _num)
{
    sx_assert(dst);
    sx_assert(src);

    const int len = sx__strnlen(src, _num);
    const int32_t max = dst_sz - 1;
    const int32_t num = (len < max ? len : max);
    if (num > 0) {
        sx_memcpy(dst, src, num);
    }
    dst[num] = '\0';

    return &dst[num];
}